

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O3

void duckdb::Vector::DebugTransformToDictionary(Vector *vector,idx_t count)

{
  undefined1 auVar1 [16];
  sel_t sVar2;
  idx_t iVar3;
  ulong uVar4;
  idx_t iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  SelectionVector original_sel;
  SelectionVector inverted_sel;
  Vector inverted_vector;
  SelectionVector local_c0;
  SelectionVector local_a8;
  Vector local_90;
  long lVar8;
  
  if (vector->vector_type == FLAT_VECTOR) {
    iVar5 = count * 2;
    SelectionVector::SelectionVector(&local_a8,iVar5);
    if (count != 0) {
      iVar3 = 0;
      sVar2 = (sel_t)count;
      do {
        sVar2 = sVar2 - 1;
        local_a8.sel_vector[iVar3 * 2] = sVar2;
        local_a8.sel_vector[iVar3 * 2 + 1] = sVar2;
        iVar3 = iVar3 + 1;
      } while (iVar3 != count);
    }
    Vector(&local_90,vector,&local_a8,iVar5);
    Flatten(&local_90,iVar5);
    if (count != 0) {
      iVar3 = 0;
      iVar5 = count;
      do {
        FlatVector::SetNull(&local_90,iVar3,true);
        iVar3 = iVar3 + 2;
        iVar5 = iVar5 - 1;
      } while (iVar5 != 0);
    }
    SelectionVector::SelectionVector(&local_c0,count);
    auVar1 = _DAT_01d8a390;
    if (count != 0) {
      lVar8 = count - 1;
      auVar6._8_4_ = (int)lVar8;
      auVar6._0_8_ = lVar8;
      auVar6._12_4_ = (int)((ulong)lVar8 >> 0x20);
      sVar2 = (sel_t)count * 2 - 3;
      uVar4 = 0;
      auVar6 = auVar6 ^ _DAT_01d8a390;
      auVar7 = _DAT_01d8a380;
      do {
        auVar9 = auVar7 ^ auVar1;
        if ((bool)(~(auVar9._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar9._0_4_ ||
                    auVar6._4_4_ < auVar9._4_4_) & 1)) {
          local_c0.sel_vector[uVar4] = sVar2 + 2;
        }
        if ((auVar9._12_4_ != auVar6._12_4_ || auVar9._8_4_ <= auVar6._8_4_) &&
            auVar9._12_4_ <= auVar6._12_4_) {
          local_c0.sel_vector[uVar4 + 1] = sVar2;
        }
        uVar4 = uVar4 + 2;
        lVar8 = auVar7._8_8_;
        auVar7._0_8_ = auVar7._0_8_ + 2;
        auVar7._8_8_ = lVar8 + 2;
        sVar2 = sVar2 - 4;
      } while ((count + 1 & 0xfffffffffffffffe) != uVar4);
    }
    Reference(vector,&local_90);
    Slice(vector,&local_c0,count);
    FlatVector::IncrementalSelectionVector();
    if (local_c0.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_90.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_90.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_90.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_90.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&local_90.type);
    if (local_a8.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  return;
}

Assistant:

void Vector::DebugTransformToDictionary(Vector &vector, idx_t count) {
	if (vector.GetVectorType() != VectorType::FLAT_VECTOR) {
		// only supported for flat vectors currently
		return;
	}
	// convert vector to dictionary vector
	// first create an inverted vector of twice the size with NULL values every other value
	// i.e. [1, 2, 3] is converted into [NULL, 3, NULL, 2, NULL, 1]
	idx_t verify_count = count * 2;
	SelectionVector inverted_sel(verify_count);
	idx_t offset = 0;
	for (idx_t i = 0; i < count; i++) {
		idx_t current_index = count - i - 1;
		inverted_sel.set_index(offset++, current_index);
		inverted_sel.set_index(offset++, current_index);
	}
	Vector inverted_vector(vector, inverted_sel, verify_count);
	inverted_vector.Flatten(verify_count);
	// now insert the NULL values at every other position
	for (idx_t i = 0; i < count; i++) {
		FlatVector::SetNull(inverted_vector, i * 2, true);
	}
	// construct the selection vector pointing towards the original values
	// we start at the back, (verify_count - 1) and move backwards
	SelectionVector original_sel(count);
	offset = 0;
	for (idx_t i = 0; i < count; i++) {
		original_sel.set_index(offset++, verify_count - 1 - i * 2);
	}
	// now slice the inverted vector with the inverted selection vector
	vector.Slice(inverted_vector, original_sel, count);
	vector.Verify(count);
}